

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_wal_autocheckpoint(sqlite3 *db,int nFrame)

{
  void *pArg;
  code *xCallback;
  
  if (nFrame < 1) {
    xCallback = (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0;
    pArg = (void *)0x0;
  }
  else {
    pArg = (void *)(ulong)(uint)nFrame;
    xCallback = sqlite3WalDefaultHook;
  }
  sqlite3_wal_hook(db,xCallback,pArg);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_wal_autocheckpoint(sqlite3 *db, int nFrame){
#ifdef SQLITE_OMIT_WAL
  UNUSED_PARAMETER(db);
  UNUSED_PARAMETER(nFrame);
#else
  if( nFrame>0 ){
    sqlite3_wal_hook(db, sqlite3WalDefaultHook, SQLITE_INT_TO_PTR(nFrame));
  }else{
    sqlite3_wal_hook(db, 0, 0);
  }
#endif
  return SQLITE_OK;
}